

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O2

void directed_flag_complex_in_memory_computer::
     prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
               (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *complex,
               filtered_directed_graph_t *graph,filtration_algorithm_t *filtration_algorithm,
               size_t nb_threads)

{
  pointer pfVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  int iVar4;
  ostream *poVar5;
  pointer puVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  long lVar10;
  _Vector_base<float,_std::allocator<float>_> *this;
  unsigned_short *puVar11;
  float *pfVar12;
  pointer vertices;
  size_t index;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  float extraout_XMM0_Da;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  reorder_filtration;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  _Vector_base<float,_std::allocator<float>_> _Stack_60;
  reorder_edges_t local_48;
  
  if (filtration_algorithm == (filtration_algorithm_t *)0x0) {
    new_filtrations.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
    new_filtrations.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._2_2_ = 0;
    this = (_Vector_base<float,_std::allocator<float>_> *)&new_edges;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this,
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,
               (value_type_conflict2 *)&new_filtrations,(allocator_type *)&reorder_filtration);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(&graph->vertex_filtration,this);
  }
  else {
    iVar4 = (*filtration_algorithm->_vptr_filtration_algorithm_t[3])(filtration_algorithm);
    if ((char)iVar4 != '\0') {
      new_edges.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_vertex_00166290;
      for (new_filtrations.
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_2_ = 0;
          (ushort)new_filtrations.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start <
          (graph->super_directed_graph_t).number_of_vertices;
          new_filtrations.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_2_ =
               (ushort)new_filtrations.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) {
        new_edges.
        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&new_filtrations;
        (*filtration_algorithm->_vptr_filtration_algorithm_t[2])
                  (filtration_algorithm,0,&new_edges,graph,0);
        (graph->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start
        [(ushort)new_filtrations.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start] = extraout_XMM0_Da;
      }
    }
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar4 = (*filtration_algorithm->_vptr_filtration_algorithm_t[4])(filtration_algorithm);
      if ((char)iVar4 == '\0') {
        puVar6 = (graph->super_directed_graph_t).edges.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        vertices = puVar6;
        for (uVar14 = 0;
            uVar14 < (ulong)((long)(graph->super_directed_graph_t).edges.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 1)
                     >> 1; uVar14 = uVar14 + 1) {
          directed_flag_complex_in_memory_t<std::pair<int,float>>::set_data<unsigned_short*>
                    ((directed_flag_complex_in_memory_t<std::pair<int,float>> *)complex,1,vertices,
                     (pair<int,_float>)((ulong)(uint)pfVar1[uVar14] << 0x20 | 0xffffffff));
          vertices = vertices + 2;
          puVar6 = (graph->super_directed_graph_t).edges.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        bVar9 = true;
        goto LAB_001464a7;
      }
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    std::operator<<(poVar5,"computing the filtration of all edges");
    poVar5 = (ostream *)std::ostream::flush();
    std::operator<<(poVar5,"\r");
    new_edges.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(new_edges.
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
    _Stack_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Stack_60._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_60._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    new_edges.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)filtration_algorithm;
    new_edges.
    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)graph;
    directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
    for_each_cell<directed_flag_complex_in_memory_computer::compute_filtration_t>
              (complex,(compute_filtration_t *)&new_edges,1,-1);
    pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    this = &_Stack_60;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&new_filtrations,
               (vector<float,_std::allocator<float>_> *)this);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&graph->edge_filtration,
               (_Vector_base<float,_std::allocator<float>_> *)&new_filtrations);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&new_filtrations);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this);
  bVar9 = false;
LAB_001464a7:
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&new_edges,nb_threads,(allocator_type *)&new_filtrations);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&new_filtrations,nb_threads,(allocator_type *)&reorder_filtration);
  reorder_filtration.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reorder_filtration.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reorder_filtration.
  super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar13 = 0;
  sVar8 = nb_threads;
  while (bVar15 = sVar8 != 0, sVar8 = sVar8 - 1, bVar15) {
    local_48.new_edges =
         (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
         ((long)&((new_edges.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar13);
    local_48.new_filtration =
         (vector<float,_std::allocator<float>_> *)
         (CONCAT44(new_filtrations.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   CONCAT22(new_filtrations.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._2_2_,
                            (ushort)new_filtrations.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) + lVar13);
    local_48.reorder_filtration = bVar9;
    std::
    vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
    ::emplace_back<directed_flag_complex_in_memory_computer::reorder_edges_t>
              (&reorder_filtration,&local_48);
    lVar13 = lVar13 + 0x18;
  }
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
  for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
            (complex,&reorder_filtration,1,-1);
  lVar13 = CONCAT44(new_filtrations.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    CONCAT22(new_filtrations.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._2_2_,
                             (ushort)new_filtrations.
                                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  lVar7 = 0;
  lVar10 = 0;
  for (sVar8 = 0; sVar8 != nb_threads; sVar8 = sVar8 + 1) {
    puVar2 = new_edges.
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar8].
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar6 = (graph->super_directed_graph_t).edges.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (puVar11 = new_edges.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar8].
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1) {
      puVar6[lVar10] = *puVar11;
      lVar10 = lVar10 + 1;
    }
    if (bVar9 != false) {
      pfVar3 = *(float **)(lVar13 + 8 + sVar8 * 0x18);
      pfVar1 = (graph->edge_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pfVar12 = *(float **)(lVar13 + sVar8 * 0x18); pfVar12 != pfVar3; pfVar12 = pfVar12 + 1) {
        pfVar1[lVar7] = *pfVar12;
        lVar7 = lVar7 + 1;
      }
    }
  }
  std::
  _Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ::~_Vector_base(&reorder_filtration.
                   super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                 );
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&new_filtrations);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&new_edges);
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		compute_filtration_t compute_filtration(filtration_algorithm, graph, complex);
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration = compute_filtration.filtration();
	}

	// Reorder the edge filtration
	if (!computed_edge_filtration && filtration_algorithm != nullptr) {
		vertex_index_t* edge = &graph.edges[0];
		value_t* filtration = &graph.edge_filtration[0];
		for (size_t index = 0; index < graph.edge_number(); ++index, edge += 2, ++filtration) {
			complex.set_data(1, edge, std::make_pair(-1, *filtration));
		}
	}

	// Now reorder the edges
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);
	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++)
		reorder_filtration.push_back(reorder_edges_t(new_edges[i], new_filtrations[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr));
	complex.for_each_cell(reorder_filtration, 1);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
		if (!computed_edge_filtration && filtration_algorithm != nullptr)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
	}
}